

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTypedConstraint.h
# Opt level: O3

btScalar btAdjustAngleToLimits
                   (btScalar angleInRadians,btScalar angleLowerLimitInRadians,
                   btScalar angleUpperLimitInRadians)

{
  float fVar1;
  float fVar2;
  
  if (angleLowerLimitInRadians < angleUpperLimitInRadians) {
    if (angleLowerLimitInRadians <= angleInRadians) {
      if (angleUpperLimitInRadians < angleInRadians) {
        fVar1 = fmodf(angleInRadians - angleUpperLimitInRadians,6.2831855);
        if (-3.1415927 <= fVar1) {
          if (3.1415927 < fVar1) {
            fVar1 = fVar1 + -6.2831855;
          }
        }
        else {
          fVar1 = fVar1 + 6.2831855;
        }
        fVar2 = fmodf(angleInRadians - angleLowerLimitInRadians,6.2831855);
        if (-3.1415927 <= fVar2) {
          if (3.1415927 < fVar2) {
            fVar2 = fVar2 + -6.2831855;
          }
        }
        else {
          fVar2 = fVar2 + 6.2831855;
        }
        angleInRadians =
             (btScalar)
             (~-(uint)(ABS(fVar2) < ABS(fVar1)) & (uint)angleInRadians |
             (uint)(angleInRadians + -6.2831855) & -(uint)(ABS(fVar2) < ABS(fVar1)));
      }
    }
    else {
      fVar1 = fmodf(angleLowerLimitInRadians - angleInRadians,6.2831855);
      if (-3.1415927 <= fVar1) {
        if (3.1415927 < fVar1) {
          fVar1 = fVar1 + -6.2831855;
        }
      }
      else {
        fVar1 = fVar1 + 6.2831855;
      }
      fVar2 = fmodf(angleUpperLimitInRadians - angleInRadians,6.2831855);
      if (-3.1415927 <= fVar2) {
        if (3.1415927 < fVar2) {
          fVar2 = fVar2 + -6.2831855;
        }
      }
      else {
        fVar2 = fVar2 + 6.2831855;
      }
      angleInRadians =
           (btScalar)
           ((uint)angleInRadians & -(uint)(ABS(fVar1) < ABS(fVar2)) |
           ~-(uint)(ABS(fVar1) < ABS(fVar2)) & (uint)(angleInRadians + 6.2831855));
    }
  }
  return angleInRadians;
}

Assistant:

SIMD_FORCE_INLINE btScalar btAdjustAngleToLimits(btScalar angleInRadians, btScalar angleLowerLimitInRadians, btScalar angleUpperLimitInRadians)
{
	if(angleLowerLimitInRadians >= angleUpperLimitInRadians)
	{
		return angleInRadians;
	}
	else if(angleInRadians < angleLowerLimitInRadians)
	{
		btScalar diffLo = btFabs(btNormalizeAngle(angleLowerLimitInRadians - angleInRadians));
		btScalar diffHi = btFabs(btNormalizeAngle(angleUpperLimitInRadians - angleInRadians));
		return (diffLo < diffHi) ? angleInRadians : (angleInRadians + SIMD_2_PI);
	}
	else if(angleInRadians > angleUpperLimitInRadians)
	{
		btScalar diffHi = btFabs(btNormalizeAngle(angleInRadians - angleUpperLimitInRadians));
		btScalar diffLo = btFabs(btNormalizeAngle(angleInRadians - angleLowerLimitInRadians));
		return (diffLo < diffHi) ? (angleInRadians - SIMD_2_PI) : angleInRadians;
	}
	else
	{
		return angleInRadians;
	}
}